

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

float trng::math::detail::Beta<float>(float x,float y)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (Beta<float>(float,float)::ln_max == '\0') {
    Beta<float>();
  }
  if ((x <= 0.0) || (y <= 0.0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    fVar2 = NAN;
  }
  else {
    fVar2 = x + y;
    fVar3 = logf(fVar2);
    if (Beta<float>::ln_max < fVar3 * fVar2 - fVar2) {
      fVar3 = lgammaf(x);
      fVar4 = lgammaf(y);
      fVar2 = lgammaf(fVar2);
      fVar2 = expf((fVar4 + fVar3) - fVar2);
      return fVar2;
    }
    fVar3 = tgammaf(x);
    fVar4 = tgammaf(fVar2);
    fVar2 = tgammaf(y);
    fVar2 = fVar2 * (fVar3 / fVar4);
  }
  return fVar2;
}

Assistant:

TRNG_CUDA_ENABLE T Beta(T x, T y) {
        static const T ln_max{ln(numeric_limits<T>::max())};
        if (x <= 0 or y <= 0) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::signaling_NaN();
        }
        const T z{x + y};
        if (z * ln(z) - z > ln_max)
          // less accurate but avoids overflow
          return exp(ln_Gamma(x) + ln_Gamma(y) - ln_Gamma(z));
        return Gamma(x) / Gamma(z) * Gamma(y);
      }